

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gens_opn2.cpp
# Opt level: O0

void __thiscall GensOPN2::writeReg(GensOPN2 *this,uint32_t port,uint16_t addr,uint8_t data)

{
  Ym2612 *this_00;
  undefined6 in_register_0000000a;
  Ym2612 *chip;
  uint8_t data_local;
  uint16_t addr_local;
  uint32_t port_local;
  GensOPN2 *this_local;
  
  this_00 = this->chip;
  if (port == 0) {
    LibGens::Ym2612::write(this_00,0,(void *)(ulong)(byte)addr,CONCAT62(in_register_0000000a,addr));
    LibGens::Ym2612::write(this_00,1,(void *)(ulong)data,CONCAT62(in_register_0000000a,addr));
  }
  else if (port == 1) {
    LibGens::Ym2612::write(this_00,2,(void *)(ulong)(byte)addr,CONCAT62(in_register_0000000a,addr));
    LibGens::Ym2612::write(this_00,3,(void *)(ulong)data,CONCAT62(in_register_0000000a,addr));
  }
  return;
}

Assistant:

void GensOPN2::writeReg(uint32_t port, uint16_t addr, uint8_t data)
{
     LibGens::Ym2612 *chip = this->chip;

    switch (port)
    {
    case 0:
        chip->write(0, addr);
        chip->write(1, data);
        break;
    case 1:
        chip->write(2, addr);
        chip->write(3, data);
        break;
    }
}